

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_adaptor_sig_verify_helper
              (secp256k1_context *ctx,secp256k1_ge *result,secp256k1_scalar *sigr,
              secp256k1_scalar *sigs,secp256k1_ge *pubkey,secp256k1_scalar *message)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_scalar u2;
  secp256k1_gej pubkeyj;
  secp256k1_gej pr;
  secp256k1_scalar local_198;
  secp256k1_scalar local_178;
  secp256k1_scalar local_158;
  undefined1 local_138 [64];
  uint64_t uStack_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t uStack_d8;
  uint64_t local_d0;
  uint64_t uStack_c8;
  int local_c0;
  secp256k1_gej local_b0;
  
  iVar70 = 0;
  if ((((sigr->d[1] != 0 || sigr->d[0] != 0) || sigr->d[2] != 0) || sigr->d[3] != 0) &&
     (iVar70 = 0, ((sigs->d[1] != 0 || sigs->d[0] != 0) || sigs->d[2] != 0) || sigs->d[3] != 0)) {
    secp256k1_scalar_inverse(&local_178,sigs);
    uVar72 = message->d[0];
    uVar73 = message->d[1];
    uVar1 = message->d[2];
    uVar2 = message->d[3];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_178.d[0];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar72;
    uVar74 = SUB168(auVar3 * auVar35,8);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar74;
    local_138._0_8_ = SUB168(auVar3 * auVar35,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_178.d[0];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar73;
    auVar4 = auVar4 * auVar36;
    uVar79 = SUB168(auVar4 + auVar68,0);
    uVar83 = SUB168(auVar4 + auVar68,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_178.d[1];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar72;
    uVar75 = SUB168(auVar5 * auVar37,8);
    uVar71 = SUB168(auVar5 * auVar37,0);
    local_138._8_8_ = uVar79 + uVar71;
    uVar71 = (ulong)CARRY8(uVar79,uVar71);
    uVar79 = uVar83 + uVar75;
    uVar84 = uVar79 + uVar71;
    uVar85 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar74,auVar4._0_8_)) +
             (ulong)(CARRY8(uVar83,uVar75) || CARRY8(uVar79,uVar71));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_178.d[0];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar1;
    uVar76 = SUB168(auVar6 * auVar38,8);
    uVar71 = SUB168(auVar6 * auVar38,0);
    uVar74 = uVar84 + uVar71;
    uVar71 = (ulong)CARRY8(uVar84,uVar71);
    uVar75 = uVar85 + uVar76;
    uVar86 = uVar75 + uVar71;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_178.d[1];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar73;
    uVar77 = SUB168(auVar7 * auVar39,8);
    uVar79 = SUB168(auVar7 * auVar39,0);
    uVar84 = uVar74 + uVar79;
    uVar79 = (ulong)CARRY8(uVar74,uVar79);
    uVar83 = uVar86 + uVar77;
    uVar87 = uVar83 + uVar79;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_178.d[2];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar72;
    uVar78 = SUB168(auVar8 * auVar40,8);
    uVar74 = SUB168(auVar8 * auVar40,0);
    local_138._16_8_ = uVar84 + uVar74;
    uVar74 = (ulong)CARRY8(uVar84,uVar74);
    uVar84 = uVar87 + uVar78;
    uVar88 = uVar84 + uVar74;
    uVar87 = (ulong)(CARRY8(uVar85,uVar76) || CARRY8(uVar75,uVar71)) +
             (ulong)(CARRY8(uVar86,uVar77) || CARRY8(uVar83,uVar79)) +
             (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar84,uVar74));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_178.d[0];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar2;
    uVar77 = SUB168(auVar9 * auVar41,8);
    uVar71 = SUB168(auVar9 * auVar41,0);
    uVar74 = uVar88 + uVar71;
    uVar71 = (ulong)CARRY8(uVar88,uVar71);
    uVar75 = uVar87 + uVar77;
    uVar88 = uVar75 + uVar71;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_178.d[1];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar1;
    uVar78 = SUB168(auVar10 * auVar42,8);
    uVar79 = SUB168(auVar10 * auVar42,0);
    uVar84 = uVar74 + uVar79;
    uVar79 = (ulong)CARRY8(uVar74,uVar79);
    uVar83 = uVar88 + uVar78;
    uVar80 = uVar83 + uVar79;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_178.d[2];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar73;
    uVar85 = SUB168(auVar11 * auVar43,8);
    uVar74 = SUB168(auVar11 * auVar43,0);
    uVar76 = uVar84 + uVar74;
    uVar74 = (ulong)CARRY8(uVar84,uVar74);
    uVar84 = uVar80 + uVar85;
    uVar81 = uVar84 + uVar74;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_178.d[3];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar72;
    uVar86 = SUB168(auVar12 * auVar44,8);
    uVar72 = SUB168(auVar12 * auVar44,0);
    local_138._24_8_ = uVar76 + uVar72;
    uVar72 = (ulong)CARRY8(uVar76,uVar72);
    uVar76 = uVar81 + uVar86;
    uVar82 = uVar76 + uVar72;
    uVar77 = (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar75,uVar71)) +
             (ulong)(CARRY8(uVar88,uVar78) || CARRY8(uVar83,uVar79)) +
             (ulong)(CARRY8(uVar80,uVar85) || CARRY8(uVar84,uVar74)) +
             (ulong)(CARRY8(uVar81,uVar86) || CARRY8(uVar76,uVar72));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_178.d[1];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar2;
    uVar83 = SUB168(auVar13 * auVar45,8);
    uVar72 = SUB168(auVar13 * auVar45,0);
    uVar74 = uVar82 + uVar72;
    uVar72 = (ulong)CARRY8(uVar82,uVar72);
    uVar79 = uVar77 + uVar83;
    uVar78 = uVar79 + uVar72;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_178.d[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar1;
    uVar84 = SUB168(auVar14 * auVar46,8);
    uVar71 = SUB168(auVar14 * auVar46,0);
    uVar75 = uVar74 + uVar71;
    uVar71 = (ulong)CARRY8(uVar74,uVar71);
    uVar74 = uVar78 + uVar84;
    uVar85 = uVar74 + uVar71;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_178.d[3];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar73;
    uVar76 = SUB168(auVar15 * auVar47,8);
    uVar73 = SUB168(auVar15 * auVar47,0);
    local_138._32_8_ = uVar75 + uVar73;
    uVar73 = (ulong)CARRY8(uVar75,uVar73);
    uVar75 = uVar85 + uVar76;
    uVar86 = uVar75 + uVar73;
    uVar83 = (ulong)(CARRY8(uVar77,uVar83) || CARRY8(uVar79,uVar72)) +
             (ulong)(CARRY8(uVar78,uVar84) || CARRY8(uVar74,uVar71)) +
             (ulong)(CARRY8(uVar85,uVar76) || CARRY8(uVar75,uVar73));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_178.d[2];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar2;
    uVar79 = SUB168(auVar16 * auVar48,8);
    uVar72 = SUB168(auVar16 * auVar48,0);
    uVar75 = uVar86 + uVar72;
    uVar72 = (ulong)CARRY8(uVar86,uVar72);
    uVar71 = uVar83 + uVar79;
    uVar84 = uVar71 + uVar72;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_178.d[3];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar1;
    uVar74 = SUB168(auVar17 * auVar49,8);
    uVar73 = SUB168(auVar17 * auVar49,0);
    local_138._40_8_ = uVar75 + uVar73;
    uVar73 = (ulong)CARRY8(uVar75,uVar73);
    uVar1 = uVar84 + uVar74;
    local_138._56_8_ =
         (ulong)(CARRY8(uVar83,uVar79) || CARRY8(uVar71,uVar72)) +
         (ulong)(CARRY8(uVar84,uVar74) || CARRY8(uVar1,uVar73));
    local_138._48_8_ = uVar1 + uVar73;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_178.d[3];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar2;
    local_138._48_16_ = auVar18 * auVar50 + local_138._48_16_;
    secp256k1_scalar_reduce_512(&local_198,(uint64_t *)local_138);
    uVar72 = sigr->d[0];
    uVar73 = sigr->d[1];
    uVar1 = sigr->d[2];
    uVar2 = sigr->d[3];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_178.d[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar72;
    uVar74 = SUB168(auVar19 * auVar51,8);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar74;
    local_138._0_8_ = SUB168(auVar19 * auVar51,0);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_178.d[0];
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar73;
    auVar20 = auVar20 * auVar52;
    uVar79 = SUB168(auVar20 + auVar69,0);
    uVar83 = SUB168(auVar20 + auVar69,8);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_178.d[1];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar72;
    uVar75 = SUB168(auVar21 * auVar53,8);
    uVar71 = SUB168(auVar21 * auVar53,0);
    local_138._8_8_ = uVar79 + uVar71;
    uVar71 = (ulong)CARRY8(uVar79,uVar71);
    uVar79 = uVar83 + uVar75;
    uVar84 = uVar79 + uVar71;
    uVar85 = (ulong)CARRY8(auVar20._8_8_,(ulong)CARRY8(uVar74,auVar20._0_8_)) +
             (ulong)(CARRY8(uVar83,uVar75) || CARRY8(uVar79,uVar71));
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_178.d[0];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar1;
    uVar76 = SUB168(auVar22 * auVar54,8);
    uVar71 = SUB168(auVar22 * auVar54,0);
    uVar74 = uVar84 + uVar71;
    uVar71 = (ulong)CARRY8(uVar84,uVar71);
    uVar75 = uVar85 + uVar76;
    uVar86 = uVar75 + uVar71;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_178.d[1];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar73;
    uVar77 = SUB168(auVar23 * auVar55,8);
    uVar79 = SUB168(auVar23 * auVar55,0);
    uVar84 = uVar74 + uVar79;
    uVar79 = (ulong)CARRY8(uVar74,uVar79);
    uVar83 = uVar86 + uVar77;
    uVar87 = uVar83 + uVar79;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_178.d[2];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar72;
    uVar78 = SUB168(auVar24 * auVar56,8);
    uVar74 = SUB168(auVar24 * auVar56,0);
    local_138._16_8_ = uVar84 + uVar74;
    uVar74 = (ulong)CARRY8(uVar84,uVar74);
    uVar84 = uVar87 + uVar78;
    uVar88 = uVar84 + uVar74;
    uVar87 = (ulong)(CARRY8(uVar85,uVar76) || CARRY8(uVar75,uVar71)) +
             (ulong)(CARRY8(uVar86,uVar77) || CARRY8(uVar83,uVar79)) +
             (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar84,uVar74));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_178.d[0];
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar2;
    uVar77 = SUB168(auVar25 * auVar57,8);
    uVar71 = SUB168(auVar25 * auVar57,0);
    uVar74 = uVar88 + uVar71;
    uVar71 = (ulong)CARRY8(uVar88,uVar71);
    uVar75 = uVar87 + uVar77;
    uVar88 = uVar75 + uVar71;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_178.d[1];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar1;
    uVar78 = SUB168(auVar26 * auVar58,8);
    uVar79 = SUB168(auVar26 * auVar58,0);
    uVar84 = uVar74 + uVar79;
    uVar79 = (ulong)CARRY8(uVar74,uVar79);
    uVar83 = uVar88 + uVar78;
    uVar80 = uVar83 + uVar79;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_178.d[2];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar73;
    uVar85 = SUB168(auVar27 * auVar59,8);
    uVar74 = SUB168(auVar27 * auVar59,0);
    uVar76 = uVar84 + uVar74;
    uVar74 = (ulong)CARRY8(uVar84,uVar74);
    uVar84 = uVar80 + uVar85;
    uVar81 = uVar84 + uVar74;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_178.d[3];
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar72;
    uVar86 = SUB168(auVar28 * auVar60,8);
    uVar72 = SUB168(auVar28 * auVar60,0);
    local_138._24_8_ = uVar76 + uVar72;
    uVar72 = (ulong)CARRY8(uVar76,uVar72);
    uVar76 = uVar81 + uVar86;
    uVar82 = uVar76 + uVar72;
    uVar77 = (ulong)(CARRY8(uVar87,uVar77) || CARRY8(uVar75,uVar71)) +
             (ulong)(CARRY8(uVar88,uVar78) || CARRY8(uVar83,uVar79)) +
             (ulong)(CARRY8(uVar80,uVar85) || CARRY8(uVar84,uVar74)) +
             (ulong)(CARRY8(uVar81,uVar86) || CARRY8(uVar76,uVar72));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_178.d[1];
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar2;
    uVar83 = SUB168(auVar29 * auVar61,8);
    uVar72 = SUB168(auVar29 * auVar61,0);
    uVar74 = uVar82 + uVar72;
    uVar72 = (ulong)CARRY8(uVar82,uVar72);
    uVar79 = uVar77 + uVar83;
    uVar78 = uVar79 + uVar72;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_178.d[2];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar1;
    uVar84 = SUB168(auVar30 * auVar62,8);
    uVar71 = SUB168(auVar30 * auVar62,0);
    uVar75 = uVar74 + uVar71;
    uVar71 = (ulong)CARRY8(uVar74,uVar71);
    uVar74 = uVar78 + uVar84;
    uVar85 = uVar74 + uVar71;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_178.d[3];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar73;
    uVar76 = SUB168(auVar31 * auVar63,8);
    uVar73 = SUB168(auVar31 * auVar63,0);
    local_138._32_8_ = uVar75 + uVar73;
    uVar73 = (ulong)CARRY8(uVar75,uVar73);
    uVar75 = uVar85 + uVar76;
    uVar86 = uVar75 + uVar73;
    uVar83 = (ulong)(CARRY8(uVar77,uVar83) || CARRY8(uVar79,uVar72)) +
             (ulong)(CARRY8(uVar78,uVar84) || CARRY8(uVar74,uVar71)) +
             (ulong)(CARRY8(uVar85,uVar76) || CARRY8(uVar75,uVar73));
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_178.d[2];
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar2;
    uVar79 = SUB168(auVar32 * auVar64,8);
    uVar72 = SUB168(auVar32 * auVar64,0);
    uVar75 = uVar86 + uVar72;
    uVar72 = (ulong)CARRY8(uVar86,uVar72);
    uVar71 = uVar83 + uVar79;
    uVar84 = uVar71 + uVar72;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_178.d[3];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar1;
    uVar74 = SUB168(auVar33 * auVar65,8);
    uVar73 = SUB168(auVar33 * auVar65,0);
    local_138._40_8_ = uVar75 + uVar73;
    uVar73 = (ulong)CARRY8(uVar75,uVar73);
    uVar1 = uVar84 + uVar74;
    auVar67._8_8_ =
         (ulong)(CARRY8(uVar83,uVar79) || CARRY8(uVar71,uVar72)) +
         (ulong)(CARRY8(uVar84,uVar74) || CARRY8(uVar1,uVar73));
    auVar67._0_8_ = uVar1 + uVar73;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_178.d[3];
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar2;
    local_138._48_16_ = auVar34 * auVar66 + auVar67;
    secp256k1_scalar_reduce_512(&local_158,(uint64_t *)local_138);
    local_c0 = pubkey->infinity;
    local_138._0_8_ = (pubkey->x).n[0];
    local_138._8_8_ = (pubkey->x).n[1];
    local_138._16_8_ = (pubkey->x).n[2];
    local_138._24_8_ = (pubkey->x).n[3];
    local_138._32_8_ = (pubkey->x).n[4];
    local_138._40_8_ = (pubkey->y).n[0];
    local_138._48_16_ = *(undefined1 (*) [16])((pubkey->y).n + 1);
    uStack_f8 = (pubkey->y).n[3];
    local_f0 = (pubkey->y).n[4];
    local_e8 = 1;
    local_e0 = 0;
    uStack_d8 = 0;
    local_d0 = 0;
    uStack_c8 = 0;
    secp256k1_ecmult(&ctx->ecmult_ctx,&local_b0,(secp256k1_gej *)local_138,&local_158,&local_198);
    iVar70 = 0;
    if (local_b0.infinity == 0) {
      secp256k1_ge_set_gej(result,&local_b0);
      iVar70 = 1;
    }
  }
  return iVar70;
}

Assistant:

SECP256K1_API int secp256k1_ecdsa_adaptor_sig_verify_helper(const secp256k1_context* ctx, secp256k1_ge *result, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_ge *pubkey, const secp256k1_scalar *message) {
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;
    secp256k1_gej pr;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_inverse_var(&sn, sigs);
    secp256k1_scalar_mul(&u1, &sn, message);
    secp256k1_scalar_mul(&u2, &sn, sigr);

    secp256k1_gej_set_ge(&pubkeyj, pubkey);
    secp256k1_ecmult(&ctx->ecmult_ctx, &pr, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&pr)) {
        return 0;
    }
    secp256k1_ge_set_gej(result, &pr);
    return 1;
}